

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
::insertTail(ListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>_>
             *this,SerialPortDesc *p)

{
  size_t *psVar1;
  SerialPortDesc *pSVar2;
  ListLink *link;
  
  pSVar2 = (this->super_ListData<axl::io::SerialPortDesc>).m_tail;
  (p->super_ListLink).m_next = (ListLink *)0x0;
  (p->super_ListLink).m_prev = &pSVar2->super_ListLink;
  if (pSVar2 == (SerialPortDesc *)0x0) {
    pSVar2 = (SerialPortDesc *)this;
  }
  (pSVar2->super_ListLink).m_next = &p->super_ListLink;
  (this->super_ListData<axl::io::SerialPortDesc>).m_tail = p;
  psVar1 = &(this->super_ListData<axl::io::SerialPortDesc>).m_count;
  *psVar1 = *psVar1 + 1;
  return (IteratorImpl<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
          )(IteratorImpl<axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::io::SerialPortDesc,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>
            )p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}